

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O1

bool __thiscall
cmServerProtocol::Activate
          (cmServerProtocol *this,cmServer *server,cmServerRequest *request,string *errorMessage)

{
  int iVar1;
  cmake *this_00;
  pointer __p;
  __uniq_ptr_impl<cmake,_std::default_delete<cmake>_> local_38;
  
  if (server != (cmServer *)0x0) {
    this->m_Server = server;
    this_00 = (cmake *)operator_new(0x388);
    cmake::cmake(this_00,RoleProject,Project);
    local_38._M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
    super__Head_base<0UL,_cmake_*,_false>._M_head_impl =
         (tuple<cmake_*,_std::default_delete<cmake>_>)
         (_Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>)0x0;
    std::__uniq_ptr_impl<cmake,_std::default_delete<cmake>_>::reset
              ((__uniq_ptr_impl<cmake,_std::default_delete<cmake>_> *)&this->m_CMakeInstance,this_00
              );
    std::unique_ptr<cmake,_std::default_delete<cmake>_>::~unique_ptr
              ((unique_ptr<cmake,_std::default_delete<cmake>_> *)&local_38);
    iVar1 = (*this->_vptr_cmServerProtocol[5])(this,request,errorMessage);
    if (SUB41(iVar1,0) == false) {
      std::__uniq_ptr_impl<cmake,_std::default_delete<cmake>_>::reset
                ((__uniq_ptr_impl<cmake,_std::default_delete<cmake>_> *)&this->m_CMakeInstance,
                 (pointer)0x0);
    }
    return SUB41(iVar1,0);
  }
  __assert_fail("server",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmServerProtocol.cxx"
                ,0x84,
                "bool cmServerProtocol::Activate(cmServer *, const cmServerRequest &, std::string *)"
               );
}

Assistant:

bool cmServerProtocol::Activate(cmServer* server,
                                const cmServerRequest& request,
                                std::string* errorMessage)
{
  assert(server);
  this->m_Server = server;
  this->m_CMakeInstance =
    cm::make_unique<cmake>(cmake::RoleProject, cmState::Project);
  const bool result = this->DoActivate(request, errorMessage);
  if (!result) {
    this->m_CMakeInstance = nullptr;
  }
  return result;
}